

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O0

QVariant * __thiscall
QSpinBoxPrivate::validateAndInterpret(QSpinBoxPrivate *this,QString *input,int *pos,State *state)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int *in_RCX;
  QString *in_RDX;
  QAbstractSpinBoxPrivate *in_RSI;
  QStringBuilder<const_QString_&,_QString_&> *in_RDI;
  State *in_R8;
  long in_FS_OFFSET;
  int num;
  int min;
  int max;
  QString copy2;
  QString doubleSep;
  QString sep;
  bool ok;
  QString copy;
  int in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeac;
  undefined1 in_stack_fffffffffffffead;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  undefined1 uVar5;
  QStringBuilder<const_QString_&,_QString_&> *this_00;
  undefined4 in_stack_fffffffffffffec8;
  int iVar6;
  QAbstractSpinBoxPrivate *this_01;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  QStringBuilder<const_QString_&,_const_QString_&> local_a8;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  byte local_63;
  QChar local_62;
  QLatin1StringView local_60;
  QLatin1StringView local_50;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  this_01 = in_RSI;
  bVar1 = ::operator==((QString *)in_RDI,
                       (QString *)
                       CONCAT17(in_stack_fffffffffffffeaf,
                                CONCAT16(in_stack_fffffffffffffeae,
                                         CONCAT15(in_stack_fffffffffffffead,
                                                  CONCAT14(in_stack_fffffffffffffeac,
                                                           in_stack_fffffffffffffea8)))));
  if ((bVar1) && (bVar1 = QString::isEmpty((QString *)0x69176d), !bVar1)) {
    *in_R8 = in_RSI->cachedState;
    ::QVariant::QVariant((QVariant *)in_RDI,(QVariant *)&in_RSI->cachedValue);
    goto LAB_00691d30;
  }
  iVar2 = ::QVariant::toInt((bool *)&in_RSI->maximum);
  iVar3 = ::QVariant::toInt((bool *)&in_RSI->minimum);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractSpinBoxPrivate::stripped(this_01,in_RDX,in_RCX);
  *in_R8 = Acceptable;
  uVar5 = false;
  iVar6 = iVar3;
  if (iVar2 != iVar3) {
    bVar1 = QString::isEmpty((QString *)0x691848);
    in_stack_fffffffffffffeae = true;
    uVar5 = true;
    if (!bVar1) {
      if (iVar6 < 0) {
        local_50 = Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)in_RDI);
        bVar1 = ::operator==((QString *)this_00,(QLatin1StringView *)in_RDI);
        in_stack_fffffffffffffeae = true;
        uVar5 = true;
        if (bVar1) goto LAB_006918fa;
      }
      in_stack_fffffffffffffead = false;
      in_stack_fffffffffffffeae = in_stack_fffffffffffffead;
      uVar5 = in_stack_fffffffffffffead;
      if (-1 < iVar2) {
        local_60 = Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)in_RDI);
        in_stack_fffffffffffffead = ::operator==((QString *)this_00,(QLatin1StringView *)in_RDI);
        in_stack_fffffffffffffeae = in_stack_fffffffffffffead;
        uVar5 = in_stack_fffffffffffffead;
      }
    }
  }
LAB_006918fa:
  if ((bool)uVar5 == false) {
    QChar::QChar<char16_t,_true>(&local_62,L'-');
    uVar4 = QString::startsWith((QChar *)&local_40,(uint)(ushort)local_62.ucs);
    if (((uVar4 & 1) == 0) || (iVar6 < 0)) {
      local_63 = 0;
      if (*(int *)&in_RSI->field_0x3d4 == 10) {
        iVar3 = QLocale::toInt((QLocale *)CONCAT44(iVar2,iVar6),
                               (QString *)CONCAT44(iVar3,in_stack_fffffffffffffec8),(bool *)in_RSI);
        if (((local_63 & 1) == 0) && ((999 < iVar2 || (iVar6 < -999)))) {
          local_80 = &DAT_aaaaaaaaaaaaaaaa;
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          local_70 = &DAT_aaaaaaaaaaaaaaaa;
          QLocale::groupSeparator();
          local_98 = &DAT_aaaaaaaaaaaaaaaa;
          local_90 = &DAT_aaaaaaaaaaaaaaaa;
          local_88 = &DAT_aaaaaaaaaaaaaaaa;
          local_a8 = ::operator+((QString *)in_RDI,
                                 (QString *)
                                 CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffeae,
                                                         CONCAT15(in_stack_fffffffffffffead,
                                                                  CONCAT14(in_stack_fffffffffffffeac
                                                                           ,
                                                  in_stack_fffffffffffffea8)))));
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<const_QString_&,_const_QString_&> *)
                     CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffeae,
                                             CONCAT15(in_stack_fffffffffffffead,
                                                      CONCAT14(in_stack_fffffffffffffeac,
                                                               in_stack_fffffffffffffea8)))));
          bVar1 = QString::contains((QString *)in_RDI,
                                    (QString *)
                                    CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffeae,
                                                            CONCAT15(in_stack_fffffffffffffead,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffffeac,
                                                  in_stack_fffffffffffffea8)))),CaseInsensitive);
          if ((bVar1) &&
             (bVar1 = QString::contains((QString *)in_RDI,
                                        (QString *)
                                        CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffeae,
                                                                CONCAT15(in_stack_fffffffffffffead,
                                                                         CONCAT14(
                                                  in_stack_fffffffffffffeac,
                                                  in_stack_fffffffffffffea8)))),CaseInsensitive),
             !bVar1)) {
            local_c0 = &DAT_aaaaaaaaaaaaaaaa;
            local_b8 = &DAT_aaaaaaaaaaaaaaaa;
            local_b0 = &DAT_aaaaaaaaaaaaaaaa;
            QString::QString((QString *)in_RDI,
                             (QString *)
                             CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffeae,
                                                     CONCAT15(in_stack_fffffffffffffead,
                                                              CONCAT14(in_stack_fffffffffffffeac,
                                                                       in_stack_fffffffffffffea8))))
                            );
            QString::remove((QString *)&local_c0,(CaseSensitivity)&local_80);
            iVar3 = QLocale::toInt((QLocale *)CONCAT44(iVar2,iVar6),
                                   (QString *)CONCAT44(iVar3,in_stack_fffffffffffffec8),
                                   (bool *)in_RSI);
            QString::~QString((QString *)0x691b62);
          }
          QString::~QString((QString *)0x691b6f);
          QString::~QString((QString *)0x691b7c);
        }
      }
      else {
        iVar3 = QString::toInt((QString *)this_00,(bool *)in_RDI,
                               CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffeae,
                                                       CONCAT11(in_stack_fffffffffffffead,
                                                                in_stack_fffffffffffffeac))));
      }
      if ((local_63 & 1) == 0) {
        *in_R8 = Invalid;
      }
      else if ((iVar3 < iVar6) || (iVar2 < iVar3)) {
        if (iVar2 == iVar6) {
          *in_R8 = Invalid;
        }
        else if (((iVar3 < 0) || (iVar3 <= iVar2)) && ((-1 < iVar3 || (iVar6 <= iVar3)))) {
          *in_R8 = Intermediate;
        }
        else {
          *in_R8 = Invalid;
        }
      }
      else {
        *in_R8 = Acceptable;
      }
    }
    else {
      *in_R8 = Invalid;
    }
  }
  else {
    *in_R8 = Intermediate;
  }
  if ((*in_R8 != Acceptable) && (in_stack_fffffffffffffea8 = iVar2, iVar3 = iVar2, 0 < iVar2)) {
    in_stack_fffffffffffffea8 = iVar6;
    iVar3 = iVar6;
  }
  ::operator+((QString *)in_RDI,
              (QString *)
              CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffeae,
                                      CONCAT15(in_stack_fffffffffffffead,
                                               CONCAT14(in_stack_fffffffffffffeac,
                                                        in_stack_fffffffffffffea8)))));
  ::operator+(in_RDI,(QString *)
                     CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffeae,
                                             CONCAT15(in_stack_fffffffffffffead,
                                                      CONCAT14(in_stack_fffffffffffffeac,
                                                               in_stack_fffffffffffffea8)))));
  ::QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_QString_&> *)
             CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffeae,
                                     CONCAT15(in_stack_fffffffffffffead,
                                              CONCAT14(in_stack_fffffffffffffeac,
                                                       in_stack_fffffffffffffea8)))));
  QString::operator=((QString *)in_RDI,
                     (QString *)
                     CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffeae,
                                             CONCAT15(in_stack_fffffffffffffead,
                                                      CONCAT14(in_stack_fffffffffffffeac,
                                                               in_stack_fffffffffffffea8)))));
  QString::~QString((QString *)0x691cae);
  QString::operator=(&in_RSI->cachedText,(QString *)in_RDX);
  in_RSI->cachedState = *in_R8;
  ::QVariant::QVariant(&local_28,iVar3);
  ::QVariant::operator=((QVariant *)this_00,(QVariant *)in_RDI);
  ::QVariant::~QVariant(&local_28);
  ::QVariant::QVariant((QVariant *)in_RDI,(QVariant *)&in_RSI->cachedValue);
  QString::~QString((QString *)0x691d30);
LAB_00691d30:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QVariant *)this_00;
}

Assistant:

QVariant QSpinBoxPrivate::validateAndInterpret(QString &input, int &pos,
                                               QValidator::State &state) const
{
    if (cachedText == input && !input.isEmpty()) {
        state = cachedState;
        QSBDEBUG() << "cachedText was '" << cachedText << "' state was "
                   << state << " and value was " << cachedValue;

        return cachedValue;
    }
    const int max = maximum.toInt();
    const int min = minimum.toInt();

    QString copy = stripped(input, &pos);
    QSBDEBUG() << "input" << input << "copy" << copy;
    state = QValidator::Acceptable;
    int num = min;

    if (max != min && (copy.isEmpty()
                       || (min < 0 && copy == "-"_L1)
                       || (max >= 0 && copy == "+"_L1))) {
        state = QValidator::Intermediate;
        QSBDEBUG() << __FILE__ << __LINE__<< "num is set to" << num;
    } else if (copy.startsWith(u'-') && min >= 0) {
        state = QValidator::Invalid; // special-case -0 will be interpreted as 0 and thus not be invalid with a range from 0-100
    } else {
        bool ok = false;
        if (displayIntegerBase != 10) {
            num = copy.toInt(&ok, displayIntegerBase);
        } else {
            num = locale.toInt(copy, &ok);
            if (!ok && (max >= 1000 || min <= -1000)) {
                const QString sep(locale.groupSeparator());
                const QString doubleSep = sep + sep;
                if (copy.contains(sep) && !copy.contains(doubleSep)) {
                    QString copy2 = copy;
                    copy2.remove(sep);
                    num = locale.toInt(copy2, &ok);
                }
            }
        }
        QSBDEBUG() << __FILE__ << __LINE__<< "num is set to" << num;
        if (!ok) {
            state = QValidator::Invalid;
        } else if (num >= min && num <= max) {
            state = QValidator::Acceptable;
        } else if (max == min) {
            state = QValidator::Invalid;
        } else {
            if ((num >= 0 && num > max) || (num < 0 && num < min)) {
                state = QValidator::Invalid;
                QSBDEBUG() << __FILE__ << __LINE__<< "state is set to Invalid";
            } else {
                state = QValidator::Intermediate;
                QSBDEBUG() << __FILE__ << __LINE__<< "state is set to Intermediate";
            }
        }
    }
    if (state != QValidator::Acceptable)
        num = max > 0 ? min : max;
    input = prefix + copy + suffix;
    cachedText = input;
    cachedState = state;
    cachedValue = QVariant((int)num);

    QSBDEBUG() << "cachedText is set to '" << cachedText << "' state is set to "
               << state << " and value is set to " << cachedValue;
    return cachedValue;
}